

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadServiceWrapperBase.cpp
# Opt level: O0

bool __thiscall ThreadServiceWrapperBase::ScheduleNextCollectOnExit(ThreadServiceWrapperBase *this)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  DWORD DVar4;
  DWORD DVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  Recycler *this_00;
  byte bVar8;
  char16_t *pcVar9;
  byte local_49;
  bool local_31;
  bool oldNeedIdleCollect;
  Recycler *recycler;
  ThreadServiceWrapperBase *this_local;
  
  bVar3 = ThreadContext::IsInScript(this->threadContext);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadServiceWrapperBase.cpp"
                       ,0xc0,"(!threadContext->IsInScript())","!threadContext->IsInScript()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (((this->needIdleCollect & 1U) != 0) && ((this->hasScheduledIdleCollect & 1U) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadServiceWrapperBase.cpp"
                       ,0xc1,"(!needIdleCollect || hasScheduledIdleCollect)",
                       "!needIdleCollect || hasScheduledIdleCollect");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  this_00 = ThreadContext::GetRecycler(this->threadContext);
  Memory::Recycler::FinishConcurrent<(Memory::CollectionFlags)270008320>(this_00);
  bVar8 = this->needIdleCollect & 1;
  if ((((this->forceIdleCollectOnce & 1U) != 0) && ((DAT_01ec73ca & 1) != 0)) &&
     (bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,IdleCollectPhase), bVar3)) {
    DVar4 = GetCurrentThreadId();
    Output::Print(L"%04X> Need to force one idle collection\n",(ulong)DVar4);
    Output::Flush();
  }
  local_31 = true;
  if ((this->forceIdleCollectOnce & 1U) == 0) {
    local_31 = Memory::Recycler::ShouldIdleCollectOnExit(this_00);
  }
  this->needIdleCollect = local_31;
  if ((this->needIdleCollect & 1U) == 0) {
    if (((DAT_01ec73ca & 1) != 0) &&
       (bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,IdleCollectPhase), bVar3)) {
      DVar4 = GetCurrentThreadId();
      pcVar9 = L"not scheduled";
      if (bVar8 != 0) {
        pcVar9 = L"cancelled";
      }
      Output::Print(L"%04X> Idle on exit collect %s\n",(ulong)DVar4,pcVar9);
      Output::Flush();
    }
    BVar6 = Memory::Recycler::CollectionInProgress(this_00);
    if (BVar6 == 0) {
      return true;
    }
    if (((DAT_01ec73ca & 1) != 0) &&
       (bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,IdleCollectPhase), bVar3)) {
      DVar4 = GetCurrentThreadId();
      local_49 = 1;
      if ((this->hasScheduledIdleCollect & 1U) == 0) {
        local_49 = bVar8;
      }
      pcVar9 = L"schedule finish";
      if (local_49 != 0) {
        pcVar9 = L"reschedule finish";
      }
      Output::Print(L"%04X> Idle on exit collect %s\n",(ulong)DVar4,pcVar9);
      Output::Flush();
    }
  }
  else {
    DVar4 = GetTickCount();
    this->tickCountNextIdleCollection = DVar4 + 1000;
    if (((DAT_01ec73ca & 1) != 0) &&
       (bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,IdleCollectPhase), bVar3)) {
      DVar4 = GetCurrentThreadId();
      pcVar9 = L"scheduled";
      if (bVar8 != 0) {
        pcVar9 = L"rescheduled";
      }
      uVar1 = this->tickCountNextIdleCollection;
      DVar5 = GetTickCount();
      Output::Print(L"%04X> Idle on exit collect %s: %d\n",(ulong)DVar4,pcVar9,
                    (ulong)(uVar1 - DVar5));
      Output::Flush();
    }
  }
  if ((this->inIdleCollect & 1U) == 0) {
    this_local._7_1_ = ScheduleIdleCollect(this,1000,false);
  }
  else {
    this->shouldScheduleIdleCollectOnExitIdle = true;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ThreadServiceWrapperBase::ScheduleNextCollectOnExit()
{
    Assert(!threadContext->IsInScript());
    Assert(!needIdleCollect || hasScheduledIdleCollect);

    Recycler* recycler = threadContext->GetRecycler();
#if ENABLE_CONCURRENT_GC
    recycler->FinishConcurrent<FinishConcurrentOnExitScript>();
#endif

#ifdef RECYCLER_TRACE
    bool oldNeedIdleCollect = needIdleCollect;

    if (forceIdleCollectOnce)
    {
        IDLE_COLLECT_VERBOSE_TRACE(_u("Need to force one idle collection\n"));
    }
#endif

    needIdleCollect = forceIdleCollectOnce || recycler->ShouldIdleCollectOnExit();

    if (needIdleCollect)
    {
        // Set up when we will do the idle decommit
        tickCountNextIdleCollection = GetTickCount() + IdleTicks;

        IDLE_COLLECT_VERBOSE_TRACE(_u("Idle on exit collect %s: %d\n"), (oldNeedIdleCollect ? _u("rescheduled") : _u("scheduled")),
            tickCountNextIdleCollection - GetTickCount());

        JS_ETW(EventWriteJSCRIPT_GC_IDLE_SCHEDULED(this));
    }
    else
    {
        IDLE_COLLECT_VERBOSE_TRACE(_u("Idle on exit collect %s\n"), oldNeedIdleCollect ? _u("cancelled") : _u("not scheduled"));
        if (!recycler->CollectionInProgress())
        {
            // We collected and finished, no need to ensure the idle collect call back.
            return true;
        }

        IDLE_COLLECT_VERBOSE_TRACE(_u("Idle on exit collect %s\n"), hasScheduledIdleCollect || oldNeedIdleCollect ? _u("reschedule finish") : _u("schedule finish"));
    }

    // Don't schedule the call back if we are already in idle call back, as we don't do anything on recursive call anyways
    // IdleCollect will schedule one if necessary
    if (inIdleCollect)
    {
        shouldScheduleIdleCollectOnExitIdle = true;
        return true;
    }
    else
    {
        return ScheduleIdleCollect(IdleTicks, false /* not schedule as task */);
    }
}